

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

void __thiscall RefTable::AllocNodes(RefTable *this,SQUnsignedInteger size)

{
  RefNode *pRVar1;
  RefNode **ppRVar2;
  long lVar3;
  RefNode *pRVar4;
  RefNode *pRVar5;
  RefNode **ppRVar6;
  
  ppRVar2 = (RefNode **)sq_vm_malloc(size * 0x28);
  pRVar1 = (RefNode *)(ppRVar2 + size);
  if (size == 1) {
    lVar3 = 0;
    pRVar5 = pRVar1;
  }
  else {
    lVar3 = 0;
    pRVar4 = pRVar1;
    ppRVar6 = ppRVar2;
    do {
      *ppRVar6 = (RefNode *)0x0;
      (pRVar4->obj).super_SQObject._unVal.pTable = (SQTable *)0x0;
      pRVar4->refs = 0;
      (pRVar4->obj).super_SQObject._type = OT_NULL;
      (pRVar4->obj).super_SQObject._unVal.pTable = (SQTable *)0x0;
      pRVar5 = pRVar4 + 1;
      pRVar4->next = pRVar5;
      lVar3 = lVar3 + -1;
      ppRVar6 = ppRVar6 + 1;
      pRVar4 = pRVar5;
    } while (1 - size != lVar3);
    lVar3 = -lVar3;
  }
  ppRVar2[lVar3] = (RefNode *)0x0;
  (pRVar5->obj).super_SQObject._unVal.pTable = (SQTable *)0x0;
  pRVar5->refs = 0;
  (pRVar5->obj).super_SQObject._type = OT_NULL;
  (pRVar5->obj).super_SQObject._unVal.pTable = (SQTable *)0x0;
  pRVar5->next = (RefNode *)0x0;
  this->_freelist = pRVar1;
  this->_nodes = pRVar1;
  this->_buckets = ppRVar2;
  this->_slotused = 0;
  this->_numofslots = size;
  return;
}

Assistant:

void RefTable::AllocNodes(SQUnsignedInteger size)
{
    RefNode **bucks;
    RefNode *nodes;
    bucks = (RefNode **)SQ_MALLOC((size * sizeof(RefNode *)) + (size * sizeof(RefNode)));
    nodes = (RefNode *)&bucks[size];
    RefNode *temp = nodes;
    SQUnsignedInteger n;
    for(n = 0; n < size - 1; n++) {
        bucks[n] = NULL;
        temp->refs = 0;
        new (&temp->obj) SQObjectPtr;
        temp->next = temp+1;
        temp++;
    }
    bucks[n] = NULL;
    temp->refs = 0;
    new (&temp->obj) SQObjectPtr;
    temp->next = NULL;
    _freelist = nodes;
    _nodes = nodes;
    _buckets = bucks;
    _slotused = 0;
    _numofslots = size;
}